

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_types.cpp
# Opt level: O2

shared_ptr<duckdb::ExtraTypeInfo,_true> __thiscall
duckdb::ExtraTypeInfo::Deserialize(ExtraTypeInfo *this,Deserializer *deserializer)

{
  unique_ptr<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>,_true> __p;
  ExtraTypeInfoType EVar1;
  ExtraTypeInfo *pEVar2;
  SerializationException *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<duckdb::ExtraTypeInfo,_true> sVar3;
  ExtraTypeInfoType type;
  shared_ptr<duckdb::ExtraTypeInfo,_true> result;
  undefined1 local_68 [39];
  allocator local_41;
  unique_ptr<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>,_true>
  extension_info;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> alias;
  
  EVar1 = Deserializer::ReadProperty<duckdb::ExtraTypeInfoType>(deserializer,100,"type");
  Deserializer::ReadPropertyWithDefault<std::__cxx11::string>(&alias,deserializer,0x65,"alias");
  Deserializer::ReadDeletedProperty<duckdb::vector<duckdb::Value,true>>
            (deserializer,0x66,"modifiers");
  Deserializer::
  ReadPropertyWithDefault<duckdb::unique_ptr<duckdb::ExtensionTypeInfo,std::default_delete<duckdb::ExtensionTypeInfo>,true>>
            ((Deserializer *)&extension_info,(field_id_t)deserializer,(char *)0x67);
  result.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  result.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  switch(EVar1) {
  case INVALID_TYPE_INFO:
    this->_vptr_ExtraTypeInfo = (_func_int **)0x0;
    *(undefined8 *)&this->type = 0;
    goto LAB_01a6a8b2;
  case GENERIC_TYPE_INFO:
    make_shared_ptr<duckdb::ExtraTypeInfo,duckdb::ExtraTypeInfoType&>(local_68);
    break;
  case DECIMAL_TYPE_INFO:
    DecimalTypeInfo::Deserialize((DecimalTypeInfo *)local_68,deserializer);
    break;
  case STRING_TYPE_INFO:
    StringTypeInfo::Deserialize((StringTypeInfo *)local_68,deserializer);
    break;
  case LIST_TYPE_INFO:
    ListTypeInfo::Deserialize((ListTypeInfo *)local_68,deserializer);
    break;
  case STRUCT_TYPE_INFO:
    StructTypeInfo::Deserialize((StructTypeInfo *)local_68,deserializer);
    break;
  case ENUM_TYPE_INFO:
    EnumTypeInfo::Deserialize((EnumTypeInfo *)local_68,deserializer);
    break;
  case USER_TYPE_INFO:
    UserTypeInfo::Deserialize((UserTypeInfo *)local_68,deserializer);
    break;
  case AGGREGATE_STATE_TYPE_INFO:
    AggregateStateTypeInfo::Deserialize((AggregateStateTypeInfo *)local_68,deserializer);
    break;
  case ARRAY_TYPE_INFO:
    ArrayTypeInfo::Deserialize((ArrayTypeInfo *)local_68,deserializer);
    break;
  case ANY_TYPE_INFO:
    AnyTypeInfo::Deserialize((AnyTypeInfo *)local_68,deserializer);
    break;
  case INTEGER_LITERAL_TYPE_INFO:
    IntegerLiteralTypeInfo::Deserialize((IntegerLiteralTypeInfo *)local_68,deserializer);
    break;
  default:
    this_00 = (SerializationException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)local_68,"Unsupported type for deserialization of ExtraTypeInfo!",&local_41
              );
    SerializationException::SerializationException(this_00,(string *)local_68);
    __cxa_throw(this_00,&SerializationException::typeinfo,::std::runtime_error::~runtime_error);
  }
  shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
            (&result,(shared_ptr<duckdb::ExtraTypeInfo,_true> *)local_68);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_68 + 8));
  pEVar2 = shared_ptr<duckdb::ExtraTypeInfo,_true>::operator->(&result);
  ::std::__cxx11::string::operator=((string *)&pEVar2->alias,(string *)&alias);
  pEVar2 = shared_ptr<duckdb::ExtraTypeInfo,_true>::operator->(&result);
  __p = extension_info;
  extension_info.
  super_unique_ptr<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>_>._M_t.
  super___uniq_ptr_impl<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ExtensionTypeInfo_*,_std::default_delete<duckdb::ExtensionTypeInfo>_>
  .super__Head_base<0UL,_duckdb::ExtensionTypeInfo_*,_false>._M_head_impl =
       (unique_ptr<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>_>)
       (__uniq_ptr_data<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>,_true,_true>
        )0x0;
  std::__uniq_ptr_impl<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>_>::
  reset((__uniq_ptr_impl<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>_>
         *)&pEVar2->extension_info,
        (pointer)__p.
                 super_unique_ptr<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>_>
                 ._M_t.
                 super___uniq_ptr_impl<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::ExtensionTypeInfo_*,_std::default_delete<duckdb::ExtensionTypeInfo>_>
                 .super__Head_base<0UL,_duckdb::ExtensionTypeInfo_*,_false>._M_head_impl);
  this->_vptr_ExtraTypeInfo =
       (_func_int **)
       result.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&this->type =
       result.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
LAB_01a6a8b2:
  result.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  result.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&result.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  ::std::unique_ptr<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>_>::
  ~unique_ptr(&extension_info.
               super_unique_ptr<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>_>
             );
  ::std::__cxx11::string::~string((string *)&alias);
  sVar3.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  sVar3.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this
  ;
  return (shared_ptr<duckdb::ExtraTypeInfo,_true>)
         sVar3.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<ExtraTypeInfo> ExtraTypeInfo::Deserialize(Deserializer &deserializer) {
	auto type = deserializer.ReadProperty<ExtraTypeInfoType>(100, "type");
	auto alias = deserializer.ReadPropertyWithDefault<string>(101, "alias");
	deserializer.ReadDeletedProperty<vector<Value>>(102, "modifiers");
	auto extension_info = deserializer.ReadPropertyWithDefault<unique_ptr<ExtensionTypeInfo>>(103, "extension_info");
	shared_ptr<ExtraTypeInfo> result;
	switch (type) {
	case ExtraTypeInfoType::AGGREGATE_STATE_TYPE_INFO:
		result = AggregateStateTypeInfo::Deserialize(deserializer);
		break;
	case ExtraTypeInfoType::ANY_TYPE_INFO:
		result = AnyTypeInfo::Deserialize(deserializer);
		break;
	case ExtraTypeInfoType::ARRAY_TYPE_INFO:
		result = ArrayTypeInfo::Deserialize(deserializer);
		break;
	case ExtraTypeInfoType::DECIMAL_TYPE_INFO:
		result = DecimalTypeInfo::Deserialize(deserializer);
		break;
	case ExtraTypeInfoType::ENUM_TYPE_INFO:
		result = EnumTypeInfo::Deserialize(deserializer);
		break;
	case ExtraTypeInfoType::GENERIC_TYPE_INFO:
		result = make_shared_ptr<ExtraTypeInfo>(type);
		break;
	case ExtraTypeInfoType::INTEGER_LITERAL_TYPE_INFO:
		result = IntegerLiteralTypeInfo::Deserialize(deserializer);
		break;
	case ExtraTypeInfoType::INVALID_TYPE_INFO:
		return nullptr;
	case ExtraTypeInfoType::LIST_TYPE_INFO:
		result = ListTypeInfo::Deserialize(deserializer);
		break;
	case ExtraTypeInfoType::STRING_TYPE_INFO:
		result = StringTypeInfo::Deserialize(deserializer);
		break;
	case ExtraTypeInfoType::STRUCT_TYPE_INFO:
		result = StructTypeInfo::Deserialize(deserializer);
		break;
	case ExtraTypeInfoType::USER_TYPE_INFO:
		result = UserTypeInfo::Deserialize(deserializer);
		break;
	default:
		throw SerializationException("Unsupported type for deserialization of ExtraTypeInfo!");
	}
	result->alias = std::move(alias);
	result->extension_info = std::move(extension_info);
	return result;
}